

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::compute_split_pca
          (clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *left_child_res,
          vec<16U,_float> *right_child_res,vq_node *parent_node)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  uint i;
  int iVar12;
  long lVar13;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar14;
  undefined4 *puVar15;
  uint *puVar16;
  ulong uVar17;
  uint uVar18;
  undefined8 *puVar19;
  long lVar20;
  undefined1 *puVar21;
  undefined4 *puVar22;
  uint x;
  long lVar23;
  float fVar24;
  float fVar25;
  vec<16U,_float> axis;
  vec<16U,_float> result_3;
  vec<16U,_float> left_child;
  vec<16U,_float> prev_axis;
  vec<16U,_float> right_child;
  matrix<16U,_16U,_float> covar;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  float local_538 [2];
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  float local_478 [18];
  undefined1 local_430 [4];
  undefined1 local_42c [60];
  undefined4 local_3f0 [240];
  
  uVar18 = (parent_node->m_vectors).m_size;
  if ((ulong)uVar18 == 2) {
    puVar16 = (parent_node->m_vectors).m_p;
    uVar18 = *puVar16;
    ppVar14 = (this->m_training_vecs).m_p;
    if (ppVar14 + uVar18 != (pair<crnlib::vec<16U,_float>,_unsigned_int> *)left_child_res) {
      lVar13 = 0;
      do {
        left_child_res->m_s[lVar13] = ppVar14[uVar18].first.m_s[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
      puVar16 = (parent_node->m_vectors).m_p;
      ppVar14 = (this->m_training_vecs).m_p;
    }
    uVar18 = puVar16[1];
    if (ppVar14 + uVar18 != (pair<crnlib::vec<16U,_float>,_unsigned_int> *)right_child_res) {
      lVar13 = 0;
      do {
        right_child_res->m_s[lVar13] = ppVar14[uVar18].first.m_s[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    }
  }
  else {
    memset(local_430,0,0x400);
    if (uVar18 != 0) {
      puVar16 = (parent_node->m_vectors).m_p;
      ppVar14 = (this->m_training_vecs).m_p;
      uVar17 = 0;
      do {
        uVar3 = puVar16[uVar17];
        lVar13 = 0;
        do {
          pfVar1 = ppVar14[uVar3].first.m_s + lVar13;
          fVar24 = pfVar1[1];
          fVar25 = pfVar1[2];
          fVar7 = pfVar1[3];
          pfVar2 = (parent_node->m_centroid).m_s + lVar13;
          fVar8 = pfVar2[1];
          fVar9 = pfVar2[2];
          fVar10 = pfVar2[3];
          lVar23 = lVar13 * 4;
          *(float *)((long)&local_578 + lVar23) = *pfVar1 - *pfVar2;
          *(float *)((long)&local_578 + lVar23 + 4) = fVar24 - fVar8;
          *(float *)((long)&uStack_570 + lVar23) = fVar25 - fVar9;
          *(float *)((long)&uStack_570 + lVar23 + 4) = fVar7 - fVar10;
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0x10);
        fVar24 = (float)ppVar14[uVar3].second;
        lVar13 = 0;
        do {
          lVar23 = lVar13 * 4;
          fVar25 = *(float *)((long)&local_578 + lVar23 + 4);
          fVar7 = *(float *)((long)&uStack_570 + lVar23);
          fVar8 = *(float *)((long)&uStack_570 + lVar23 + 4);
          lVar20 = lVar13 * 4;
          *(float *)((long)&local_4b8 + lVar20) = *(float *)((long)&local_578 + lVar23) * fVar24;
          *(float *)((long)&local_4b8 + lVar20 + 4) = fVar25 * fVar24;
          *(float *)((long)&uStack_4b0 + lVar20) = fVar7 * fVar24;
          *(float *)((long)&uStack_4b0 + lVar20 + 4) = fVar8 * fVar24;
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0x10);
        lVar13 = 0;
        puVar19 = &local_4b8;
        puVar21 = local_430;
        do {
          fVar24 = *(float *)((long)&local_578 + lVar13 * 4);
          lVar23 = -0x10;
          do {
            *(float *)(puVar21 + lVar23 * 4 + 0x40) =
                 *(float *)((long)puVar19 + lVar23 * 4 + 0x40) * fVar24 +
                 *(float *)(puVar21 + lVar23 * 4 + 0x40);
            lVar23 = lVar23 + 1;
          } while (lVar13 + lVar23 != 0);
          lVar13 = lVar13 + 1;
          puVar21 = puVar21 + 0x44;
          puVar19 = (undefined8 *)((long)puVar19 + 4);
        } while (lVar13 != 0x10);
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar18);
    }
    uVar17 = parent_node->m_total_weight;
    puVar21 = local_430;
    lVar13 = 0;
    do {
      lVar23 = -0x10;
      do {
        *(float *)(puVar21 + lVar23 * 4 + 0x40) =
             *(float *)(puVar21 + lVar23 * 4 + 0x40) * (1.0 / (float)uVar17);
        lVar23 = lVar23 + 1;
      } while (lVar13 + lVar23 != 0);
      lVar13 = lVar13 + 1;
      puVar21 = puVar21 + 0x44;
    } while (lVar13 != 0x10);
    puVar21 = local_42c;
    puVar15 = local_3f0;
    lVar13 = 0;
    do {
      lVar23 = lVar13 + 1;
      lVar20 = -0xf;
      puVar22 = puVar15;
      do {
        *puVar22 = *(undefined4 *)(puVar21 + lVar20 * 4 + 0x3c);
        lVar20 = lVar20 + 1;
        puVar22 = puVar22 + 0x10;
      } while (lVar13 + lVar20 != 0);
      puVar21 = puVar21 + 0x44;
      puVar15 = puVar15 + 0x11;
      lVar13 = lVar23;
    } while (lVar23 != 0xf);
    local_578 = 0x3f4888893f400000;
    uStack_570 = 0x3f59999a3f511111;
    local_568 = 0x3f6aaaab3f622222;
    uStack_560 = 0x3f7bbbbc3f733334;
    local_558 = 0x3f8666663f822222;
    uStack_550 = 0x3f8eeeef3f8aaaab;
    local_548 = 0x3f9777783f933334;
    uStack_540 = 0x3fa000003f9bbbbc;
    local_488 = 0x3f9777783f933334;
    uStack_480 = 0x3fa000003f9bbbbc;
    local_498 = 0x3f8666663f822222;
    uStack_490 = 0x3f8eeeef3f8aaaab;
    local_4a8 = 0x3f6aaaab3f622222;
    uStack_4a0 = 0x3f7bbbbc3f733334;
    local_4b8 = 0x3f4888893f400000;
    uStack_4b0 = 0x3f59999a3f511111;
    iVar12 = 0;
    do {
      lVar13 = 0;
      fVar24 = 0.0;
      puVar21 = local_430;
      do {
        fVar25 = 0.0;
        lVar23 = 0;
        do {
          fVar25 = fVar25 + *(float *)((long)&local_578 + lVar23 * 4) *
                            *(float *)(puVar21 + lVar23 * 4);
          lVar23 = lVar23 + 1;
        } while (lVar23 != 0x10);
        *(float *)((long)&local_4f8 + lVar13 * 4) = fVar25;
        if (fVar24 <= ABS(fVar25)) {
          fVar24 = ABS(fVar25);
        }
        lVar13 = lVar13 + 1;
        puVar21 = puVar21 + 0x40;
      } while (lVar13 != 0x10);
      if ((fVar24 != 0.0) || (NAN(fVar24))) {
        fVar24 = 1.0 / fVar24;
        lVar13 = 0;
        do {
          lVar23 = lVar13 * 4;
          fVar25 = *(float *)((long)&local_4f8 + lVar23 + 4);
          fVar7 = *(float *)((long)&uStack_4f0 + lVar23);
          fVar8 = *(float *)((long)&uStack_4f0 + lVar23 + 4);
          lVar20 = lVar13 * 4;
          *(float *)((long)&local_4f8 + lVar20) = *(float *)((long)&local_4f8 + lVar23) * fVar24;
          *(float *)((long)&local_4f8 + lVar20 + 4) = fVar25 * fVar24;
          *(float *)((long)&uStack_4f0 + lVar20) = fVar7 * fVar24;
          *(float *)((long)&uStack_4f0 + lVar20 + 4) = fVar8 * fVar24;
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0x10);
      }
      lVar13 = 0;
      do {
        lVar23 = lVar13 * 4;
        fVar24 = *(float *)((long)&local_4b8 + lVar23 + 4);
        fVar25 = *(float *)((long)&uStack_4b0 + lVar23);
        fVar7 = *(float *)((long)&uStack_4b0 + lVar23 + 4);
        lVar20 = lVar13 * 4;
        fVar8 = *(float *)((long)&local_4f8 + lVar20 + 4);
        fVar9 = *(float *)((long)&uStack_4f0 + lVar20);
        fVar10 = *(float *)((long)&uStack_4f0 + lVar20 + 4);
        local_478[lVar13] =
             *(float *)((long)&local_4b8 + lVar23) - *(float *)((long)&local_4f8 + lVar20);
        local_478[lVar13 + 1] = fVar24 - fVar8;
        local_478[lVar13 + 2] = fVar25 - fVar9;
        local_478[lVar13 + 3] = fVar7 - fVar10;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x10);
      local_488 = local_548;
      uStack_480 = uStack_540;
      local_498 = local_558;
      uStack_490 = uStack_550;
      local_4a8 = local_568;
      uStack_4a0 = uStack_560;
      local_4b8 = local_578;
      uStack_4b0 = uStack_570;
      local_578 = local_4f8;
      uVar11 = local_578;
      uStack_570 = uStack_4f0;
      local_568 = local_4e8;
      uStack_560 = uStack_4e0;
      local_558 = local_4d8;
      uStack_550 = uStack_4d0;
      local_548 = local_4c8;
      uStack_540 = uStack_4c0;
      fVar24 = local_478[0] * local_478[0];
      lVar13 = 1;
      do {
        fVar24 = fVar24 + local_478[lVar13] * local_478[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
    } while ((0.0025 <= fVar24) && (iVar12 = iVar12 + 1, iVar12 != 10));
    local_578._0_4_ = (float)local_4f8;
    dVar5 = (double)((float)local_578 * (float)local_578);
    lVar13 = 1;
    do {
      fVar24 = *(float *)((long)&local_578 + lVar13 * 4);
      dVar5 = dVar5 + (double)(fVar24 * fVar24);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    local_578 = uVar11;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      fVar24 = (float)(1.0 / dVar5);
      lVar13 = 0;
      do {
        lVar23 = lVar13 * 4;
        fVar25 = *(float *)((long)&local_578 + lVar23 + 4);
        fVar7 = *(float *)((long)&uStack_570 + lVar23);
        fVar8 = *(float *)((long)&uStack_570 + lVar23 + 4);
        lVar20 = lVar13 * 4;
        *(float *)((long)&local_578 + lVar20) = *(float *)((long)&local_578 + lVar23) * fVar24;
        *(float *)((long)&local_578 + lVar20 + 4) = fVar25 * fVar24;
        *(float *)((long)&uStack_570 + lVar20) = fVar7 * fVar24;
        *(float *)((long)&uStack_570 + lVar20 + 4) = fVar8 * fVar24;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x10);
      uVar18 = (parent_node->m_vectors).m_size;
    }
    local_4c8 = 0;
    uStack_4c0 = 0;
    local_4d8 = 0;
    uStack_4d0 = 0;
    local_4e8 = 0;
    uStack_4e0 = 0;
    local_4f8 = 0;
    uStack_4f0 = 0;
    local_478[0xc] = 0.0;
    local_478[0xd] = 0.0;
    local_478[0xe] = 0.0;
    local_478[0xf] = 0.0;
    local_478[8] = 0.0;
    local_478[9] = 0.0;
    local_478[10] = 0.0;
    local_478[0xb] = 0.0;
    local_478[4] = 0.0;
    local_478[5] = 0.0;
    local_478[6] = 0.0;
    local_478[7] = 0.0;
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    local_478[3] = 0.0;
    if (uVar18 != 0) {
      puVar16 = (parent_node->m_vectors).m_p;
      ppVar14 = (this->m_training_vecs).m_p;
      dVar5 = 0.0;
      uVar17 = 0;
      dVar6 = 0.0;
      do {
        uVar3 = puVar16[uVar17];
        uVar4 = ppVar14[uVar3].second;
        lVar13 = 0;
        do {
          pfVar1 = ppVar14[uVar3].first.m_s + lVar13;
          fVar24 = pfVar1[1];
          fVar25 = pfVar1[2];
          fVar7 = pfVar1[3];
          pfVar2 = (parent_node->m_centroid).m_s + lVar13;
          fVar8 = pfVar2[1];
          fVar9 = pfVar2[2];
          fVar10 = pfVar2[3];
          local_538[lVar13] = *pfVar1 - *pfVar2;
          local_538[lVar13 + 1] = fVar24 - fVar8;
          *(float *)((long)&uStack_530 + lVar13 * 4) = fVar25 - fVar9;
          *(float *)((long)&uStack_530 + lVar13 * 4 + 4) = fVar7 - fVar10;
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0x10);
        fVar24 = local_538[0] * (float)local_578;
        lVar13 = 1;
        do {
          fVar24 = fVar24 + local_538[lVar13] * *(float *)((long)&local_578 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x10);
        fVar25 = (float)uVar4;
        if (0.0 <= fVar24) {
          lVar13 = 0;
          do {
            pfVar1 = ppVar14[uVar3].first.m_s + lVar13;
            fVar24 = pfVar1[1];
            fVar7 = pfVar1[2];
            fVar8 = pfVar1[3];
            local_538[lVar13] = *pfVar1 * fVar25;
            local_538[lVar13 + 1] = fVar24 * fVar25;
            *(float *)((long)&uStack_530 + lVar13 * 4) = fVar7 * fVar25;
            *(float *)((long)&uStack_530 + lVar13 * 4 + 4) = fVar8 * fVar25;
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0x10);
          lVar13 = 0;
          do {
            fVar24 = local_538[lVar13 + 1];
            fVar25 = *(float *)((long)&uStack_530 + lVar13 * 4);
            fVar7 = *(float *)((long)&uStack_530 + lVar13 * 4 + 4);
            local_478[lVar13] = local_478[lVar13] + local_538[lVar13];
            local_478[lVar13 + 1] = local_478[lVar13 + 1] + fVar24;
            local_478[lVar13 + 2] = local_478[lVar13 + 2] + fVar25;
            local_478[lVar13 + 3] = local_478[lVar13 + 3] + fVar7;
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0x10);
          dVar5 = dVar5 + (double)uVar4;
        }
        else {
          lVar13 = 0;
          do {
            pfVar1 = ppVar14[uVar3].first.m_s + lVar13;
            fVar24 = pfVar1[1];
            fVar7 = pfVar1[2];
            fVar8 = pfVar1[3];
            local_538[lVar13] = *pfVar1 * fVar25;
            local_538[lVar13 + 1] = fVar24 * fVar25;
            *(float *)((long)&uStack_530 + lVar13 * 4) = fVar7 * fVar25;
            *(float *)((long)&uStack_530 + lVar13 * 4 + 4) = fVar8 * fVar25;
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0x10);
          lVar13 = 0;
          do {
            fVar24 = local_538[lVar13 + 1];
            fVar25 = *(float *)((long)&uStack_530 + lVar13 * 4);
            fVar7 = *(float *)((long)&uStack_530 + lVar13 * 4 + 4);
            lVar23 = lVar13 * 4;
            fVar8 = *(float *)((long)&local_4f8 + lVar23 + 4);
            fVar9 = *(float *)((long)&uStack_4f0 + lVar23);
            fVar10 = *(float *)((long)&uStack_4f0 + lVar23 + 4);
            lVar20 = lVar13 * 4;
            *(float *)((long)&local_4f8 + lVar20) =
                 *(float *)((long)&local_4f8 + lVar23) + local_538[lVar13];
            *(float *)((long)&local_4f8 + lVar20 + 4) = fVar8 + fVar24;
            *(float *)((long)&uStack_4f0 + lVar20) = fVar9 + fVar25;
            *(float *)((long)&uStack_4f0 + lVar20 + 4) = fVar10 + fVar7;
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0x10);
          dVar6 = dVar6 + (double)uVar4;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar18);
      if ((0.0 < dVar6) && (0.0 < dVar5)) {
        fVar24 = (float)(1.0 / dVar6);
        lVar13 = 0;
        do {
          lVar23 = lVar13 * 4;
          fVar25 = *(float *)((long)&local_4f8 + lVar23 + 4);
          fVar7 = *(float *)((long)&uStack_4f0 + lVar23);
          fVar8 = *(float *)((long)&uStack_4f0 + lVar23 + 4);
          local_538[lVar13] = *(float *)((long)&local_4f8 + lVar23) * fVar24;
          local_538[lVar13 + 1] = fVar25 * fVar24;
          *(float *)((long)&uStack_530 + lVar13 * 4) = fVar7 * fVar24;
          *(float *)((long)&uStack_530 + lVar13 * 4 + 4) = fVar8 * fVar24;
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0x10);
        *(undefined8 *)(left_child_res->m_s + 0xc) = local_508;
        *(undefined8 *)(left_child_res->m_s + 0xe) = uStack_500;
        *(undefined8 *)(left_child_res->m_s + 8) = local_518;
        *(undefined8 *)(left_child_res->m_s + 10) = uStack_510;
        *(undefined8 *)(left_child_res->m_s + 4) = local_528;
        *(undefined8 *)(left_child_res->m_s + 6) = uStack_520;
        *(ulong *)left_child_res->m_s = CONCAT44(local_538[1],local_538[0]);
        *(undefined8 *)(left_child_res->m_s + 2) = uStack_530;
        fVar24 = (float)(1.0 / dVar5);
        lVar13 = 0;
        do {
          fVar25 = local_478[lVar13 + 1];
          fVar7 = local_478[lVar13 + 2];
          fVar8 = local_478[lVar13 + 3];
          local_538[lVar13] = local_478[lVar13] * fVar24;
          local_538[lVar13 + 1] = fVar25 * fVar24;
          *(float *)((long)&uStack_530 + lVar13 * 4) = fVar7 * fVar24;
          *(float *)((long)&uStack_530 + lVar13 * 4 + 4) = fVar8 * fVar24;
          lVar13 = lVar13 + 4;
        } while (lVar13 != 0x10);
        *(undefined8 *)(right_child_res->m_s + 0xc) = local_508;
        *(undefined8 *)(right_child_res->m_s + 0xe) = uStack_500;
        *(undefined8 *)(right_child_res->m_s + 8) = local_518;
        *(undefined8 *)(right_child_res->m_s + 10) = uStack_510;
        *(undefined8 *)(right_child_res->m_s + 4) = local_528;
        *(undefined8 *)(right_child_res->m_s + 6) = uStack_520;
        *(ulong *)right_child_res->m_s = CONCAT44(local_538[1],local_538[0]);
        *(undefined8 *)(right_child_res->m_s + 2) = uStack_530;
        return;
      }
    }
    compute_split_estimate(this,left_child_res,right_child_res,parent_node);
  }
  return;
}

Assistant:

void compute_split_pca(VectorType& left_child_res, VectorType& right_child_res, const vq_node& parent_node) {
    if (parent_node.m_vectors.size() == 2) {
      left_child_res = m_training_vecs[parent_node.m_vectors[0]].first;
      right_child_res = m_training_vecs[parent_node.m_vectors[1]].first;
      return;
    }

    const uint N = VectorType::num_elements;

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const VectorType v(m_training_vecs[parent_node.m_vectors[i]].first - parent_node.m_centroid);
      const VectorType w(v * (float)m_training_vecs[parent_node.m_vectors[i]].second);

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    float one_over_total_weight = 1.0f / parent_node.m_total_weight;

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] *= one_over_total_weight;

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;  //(1.0f);
    if (N == 1)
      axis.set(1.0f);
    else {
      for (uint i = 0; i < N; i++)
        axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / math::maximum<int>(N - 1, 1)));
    }

    VectorType prev_axis(axis);

    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    VectorType left_child(0.0f);
    VectorType right_child(0.0f);

    double left_weight = 0.0f;
    double right_weight = 0.0f;

    for (uint i = 0; i < parent_node.m_vectors.size(); i++) {
      const float weight = (float)m_training_vecs[parent_node.m_vectors[i]].second;

      const VectorType& v = m_training_vecs[parent_node.m_vectors[i]].first;

      double t = (v - parent_node.m_centroid) * axis;
      if (t < 0.0f) {
        left_child += v * weight;
        left_weight += weight;
      } else {
        right_child += v * weight;
        right_weight += weight;
      }
    }

    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child_res = left_child * (float)(1.0f / left_weight);
      right_child_res = right_child * (float)(1.0f / right_weight);
    } else {
      compute_split_estimate(left_child_res, right_child_res, parent_node);
    }
  }